

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCache.c
# Opt level: O2

int cuddInitCache(DdManager *unique,uint cacheSize,uint maxCacheSize)

{
  undefined8 *puVar1;
  double dVar2;
  int iVar3;
  DdCache *pDVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  
  uVar8 = unique->slots;
  uVar7 = uVar8 >> 1;
  if (uVar7 <= cacheSize) {
    uVar7 = cacheSize;
  }
  iVar3 = cuddComputeFloorLog2(uVar7);
  iVar6 = 1;
  uVar7 = 1 << ((byte)iVar3 & 0x1f);
  pDVar4 = (DdCache *)malloc((ulong)(uVar7 + 2) * 0x28);
  unique->acache = pDVar4;
  if (pDVar4 == (DdCache *)0x0) {
    unique->errorCode = CUDD_MEMORY_OUT;
    iVar6 = 0;
  }
  else {
    pDVar4 = (DdCache *)((long)&pDVar4->f + (ulong)(0x20 - ((uint)pDVar4 & 0x1f) & 0xfffffff8));
    unique->cache = pDVar4;
    if (((ulong)pDVar4 & 0x1f) != 0) {
      __assert_fail("((ptruint) unique->cache & (32 - 1)) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/cudd/cuddCache.c"
                    ,0xac,"int cuddInitCache(DdManager *, unsigned int, unsigned int)");
    }
    unique->memused = unique->memused + (ulong)(uVar7 + 1) * 0x28;
    unique->cacheSlots = uVar7;
    uVar8 = uVar8 << 2;
    if (maxCacheSize <= uVar8) {
      uVar8 = maxCacheSize;
    }
    unique->cacheShift = 0x20 - iVar3;
    unique->maxCacheHard = maxCacheSize;
    unique->cacheSlack = (-2 << ((byte)iVar3 & 0x1f)) + uVar8;
    Cudd_SetMinHit(unique,0x1e);
    dVar2 = (double)(int)((double)uVar7 * unique->minHit + 1.0);
    unique->cacheMisses = dVar2;
    unique->cacheHits = 0.0;
    unique->totCachehits = 0.0;
    unique->totCacheMisses = -dVar2;
    unique->cachecollisions = 0.0;
    unique->cacheinserts = 0.0;
    unique->cacheLastInserts = 0.0;
    unique->cachedeletions = 0.0;
    pDVar4 = unique->cache;
    for (lVar5 = 0; (ulong)uVar7 * 0x28 - lVar5 != 0; lVar5 = lVar5 + 0x28) {
      puVar1 = (undefined8 *)((long)&pDVar4->h + lVar5);
      *puVar1 = 0;
      puVar1[1] = 0;
    }
  }
  return iVar6;
}

Assistant:

int
cuddInitCache(
  DdManager * unique /* unique table */,
  unsigned int cacheSize /* initial size of the cache */,
  unsigned int maxCacheSize /* cache size beyond which no resizing occurs */)
{
    int i;
    unsigned int logSize;
#ifndef DD_CACHE_PROFILE
    DdNodePtr *mem;
    ptruint offset;
#endif

    /* Round cacheSize to largest power of 2 not greater than the requested
    ** initial cache size. */
    logSize = cuddComputeFloorLog2(ddMax(cacheSize,unique->slots/2));
    cacheSize = 1 << logSize;
//    unique->acache = ABC_ALLOC(DdCache,cacheSize+1);
    unique->acache = ABC_ALLOC(DdCache,cacheSize+2);
    if (unique->acache == NULL) {
        unique->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    /* If the size of the cache entry is a power of 2, we want to
    ** enforce alignment to that power of two. This happens when
    ** DD_CACHE_PROFILE is not defined. */
#ifdef DD_CACHE_PROFILE
    unique->cache = unique->acache;
    unique->memused += (cacheSize) * sizeof(DdCache);
#else
    mem = (DdNodePtr *) unique->acache;
//    offset = (ptruint) mem & (sizeof(DdCache) - 1);
//    mem += (sizeof(DdCache) - offset) / sizeof(DdNodePtr);
    offset = (ptruint) mem & (32 - 1);
    mem += (32 - offset) / sizeof(DdNodePtr);
    unique->cache = (DdCache *) mem;
//    assert(((ptruint) unique->cache & (sizeof(DdCache) - 1)) == 0);
    assert(((ptruint) unique->cache & (32 - 1)) == 0);
    unique->memused += (cacheSize+1) * sizeof(DdCache);
#endif
    unique->cacheSlots = cacheSize;
    unique->cacheShift = sizeof(int) * 8 - logSize;
    unique->maxCacheHard = maxCacheSize;
    /* If cacheSlack is non-negative, we can resize. */
    unique->cacheSlack = (int) ddMin(maxCacheSize,
        DD_MAX_CACHE_TO_SLOTS_RATIO*unique->slots) -
        2 * (int) cacheSize;
    Cudd_SetMinHit(unique,DD_MIN_HIT);
    /* Initialize to avoid division by 0 and immediate resizing. */
    unique->cacheMisses = (double) (int) (cacheSize * unique->minHit + 1);
    unique->cacheHits = 0;
    unique->totCachehits = 0;
    /* The sum of cacheMisses and totCacheMisses is always correct,
    ** even though cacheMisses is larger than it should for the reasons
    ** explained above. */
    unique->totCacheMisses = -unique->cacheMisses;
    unique->cachecollisions = 0;
    unique->cacheinserts = 0;
    unique->cacheLastInserts = 0;
    unique->cachedeletions = 0;

    /* Initialize the cache */
    for (i = 0; (unsigned) i < cacheSize; i++) {
        unique->cache[i].h = 0; /* unused slots */
        unique->cache[i].data = NULL; /* invalid entry */
#ifdef DD_CACHE_PROFILE
        unique->cache[i].count = 0;
#endif
    }

    return(1);

}